

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdjs_elements_transaction.cpp
# Opt level: O2

void cfd::js::api::json::ElementsTransactionJsonApi::EstimateFee
               (EstimateFeeRequest *request,EstimateFeeResponse *response)

{
  pointer pSVar1;
  int64_t iVar2;
  pointer pSVar3;
  ElementsTransactionApi api;
  Amount tx_fee;
  pointer local_628;
  Amount utxo_fee;
  vector<cfd::api::ElementsUtxoAndOption,_std::allocator<cfd::api::ElementsUtxoAndOption>_> utxos;
  ConfidentialAssetId fee_asset;
  ElementsUtxoAndOption data;
  
  utxos.
  super__Vector_base<cfd::api::ElementsUtxoAndOption,_std::allocator<cfd::api::ElementsUtxoAndOption>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  utxos.
  super__Vector_base<cfd::api::ElementsUtxoAndOption,_std::allocator<cfd::api::ElementsUtxoAndOption>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  utxos.
  super__Vector_base<cfd::api::ElementsUtxoAndOption,_std::allocator<cfd::api::ElementsUtxoAndOption>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  cfd::core::ConfidentialAssetId::ConfidentialAssetId(&fee_asset);
  std::__cxx11::string::string((string *)&data,(string *)&request->fee_asset_);
  std::__cxx11::string::~string((string *)&data);
  if (data._8_8_ != 0) {
    std::__cxx11::string::string((string *)&tx_fee,(string *)&request->fee_asset_);
    cfd::core::ConfidentialAssetId::ConfidentialAssetId
              ((ConfidentialAssetId *)&data,(string *)&tx_fee);
    cfd::core::ConfidentialAssetId::operator=(&fee_asset,(ConfidentialAssetId *)&data);
    core::ConfidentialAssetId::~ConfidentialAssetId((ConfidentialAssetId *)&data);
    std::__cxx11::string::~string((string *)&tx_fee);
  }
  pSVar1 = (request->select_utxos_).super_JsonVector<cfd::js::api::json::SelectUtxoData>.
           super_vector<cfd::js::api::json::SelectUtxoData,_std::allocator<cfd::js::api::json::SelectUtxoData>_>
           .
           super__Vector_base<cfd::js::api::json::SelectUtxoData,_std::allocator<cfd::js::api::json::SelectUtxoData>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pSVar3 = (request->select_utxos_).super_JsonVector<cfd::js::api::json::SelectUtxoData>.
                super_vector<cfd::js::api::json::SelectUtxoData,_std::allocator<cfd::js::api::json::SelectUtxoData>_>
                .
                super__Vector_base<cfd::js::api::json::SelectUtxoData,_std::allocator<cfd::js::api::json::SelectUtxoData>_>
                ._M_impl.super__Vector_impl_data._M_start; pSVar3 != pSVar1; pSVar3 = pSVar3 + 1) {
    memset(&data,0,0x538);
    cfd::api::ElementsUtxoAndOption::ElementsUtxoAndOption(&data);
    std::__cxx11::string::string((string *)&utxo_fee,(string *)&pSVar3->txid_);
    cfd::core::Txid::Txid((Txid *)&tx_fee,(string *)&utxo_fee);
    cfd::core::Txid::operator=((Txid *)&data.field_0x28,(Txid *)&tx_fee);
    core::Txid::~Txid((Txid *)&tx_fee);
    std::__cxx11::string::~string((string *)&utxo_fee);
    data._72_4_ = pSVar3->vout_;
    std::__cxx11::string::string((string *)&tx_fee,(string *)&pSVar3->asset_);
    std::__cxx11::string::~string((string *)&tx_fee);
    if (local_628 != (pointer)0x0) {
      std::__cxx11::string::string((string *)&utxo_fee,(string *)&pSVar3->asset_);
      cfd::core::ConfidentialAssetId::ConfidentialAssetId
                ((ConfidentialAssetId *)&tx_fee,(string *)&utxo_fee);
      cfd::core::ConfidentialAssetId::operator=
                ((ConfidentialAssetId *)&data.field_0x278,(ConfidentialAssetId *)&tx_fee);
      core::ConfidentialAssetId::~ConfidentialAssetId((ConfidentialAssetId *)&tx_fee);
      std::__cxx11::string::~string((string *)&utxo_fee);
    }
    std::__cxx11::string::string((string *)&tx_fee,(string *)&pSVar3->redeem_script_);
    std::__cxx11::string::~string((string *)&tx_fee);
    if (local_628 != (pointer)0x0) {
      std::__cxx11::string::string((string *)&utxo_fee,(string *)&pSVar3->redeem_script_);
      cfd::core::Script::Script((Script *)&tx_fee,(string *)&utxo_fee);
      cfd::core::Script::operator=((Script *)&data.field_0x88,(Script *)&tx_fee);
      core::Script::~Script((Script *)&tx_fee);
      std::__cxx11::string::~string((string *)&utxo_fee);
    }
    std::__cxx11::string::string((string *)&tx_fee,(string *)&pSVar3->descriptor_);
    std::__cxx11::string::operator=((string *)&data.field_0x238,(string *)&tx_fee);
    std::__cxx11::string::~string((string *)&tx_fee);
    data._624_8_ = 0;
    std::__cxx11::string::string((string *)&tx_fee,(string *)&pSVar3->script_sig_template_);
    std::__cxx11::string::~string((string *)&tx_fee);
    if (local_628 != (pointer)0x0) {
      std::__cxx11::string::string((string *)&utxo_fee,(string *)&pSVar3->script_sig_template_);
      cfd::core::Script::Script((Script *)&tx_fee,(string *)&utxo_fee);
      cfd::core::Script::operator=((Script *)&data.field_0x4b8,(Script *)&tx_fee);
      core::Script::~Script((Script *)&tx_fee);
      std::__cxx11::string::~string((string *)&utxo_fee);
    }
    data.is_issuance = pSVar3->is_issuance_;
    data.is_blind_issuance = pSVar3->is_blind_issuance_;
    data.is_pegin = pSVar3->is_pegin_;
    data.pegin_btc_tx_size = (uint32_t)pSVar3->pegin_btc_tx_size_;
    data.pegin_txoutproof_size = pSVar3->pegin_tx_out_proof_size_;
    std::__cxx11::string::string((string *)&tx_fee,(string *)&pSVar3->claim_script_);
    std::__cxx11::string::~string((string *)&tx_fee);
    if (local_628 == (pointer)0x0) {
      std::__cxx11::string::string((string *)&tx_fee,(string *)&pSVar3->fedpeg_script_);
      std::__cxx11::string::~string((string *)&tx_fee);
    }
    else {
      std::__cxx11::string::string((string *)&utxo_fee,(string *)&pSVar3->claim_script_);
      cfd::core::Script::Script((Script *)&tx_fee,(string *)&utxo_fee);
      cfd::core::Script::operator=(&data.claim_script,(Script *)&tx_fee);
      core::Script::~Script((Script *)&tx_fee);
      std::__cxx11::string::~string((string *)&utxo_fee);
    }
    std::vector<cfd::api::ElementsUtxoAndOption,_std::allocator<cfd::api::ElementsUtxoAndOption>_>::
    push_back(&utxos,&data);
    cfd::api::ElementsUtxoAndOption::~ElementsUtxoAndOption(&data);
  }
  cfd::core::Amount::Amount(&tx_fee);
  cfd::core::Amount::Amount(&utxo_fee);
  std::__cxx11::string::string((string *)&data,(string *)&request->tx_);
  cfd::api::ElementsTransactionApi::EstimateFee
            ((string *)&api,(vector *)&data,(ConfidentialAssetId *)&utxos,(Amount *)&fee_asset,
             &tx_fee,SUB81(&utxo_fee,0),request->fee_rate_,(uint)request->is_blind_,
             request->exponent_,(uint *)(ulong)(uint)request->minimum_bits_);
  std::__cxx11::string::~string((string *)&data);
  iVar2 = cfd::core::Amount::GetSatoshiValue();
  response->fee_amount_ = iVar2;
  iVar2 = cfd::core::Amount::GetSatoshiValue();
  response->tx_fee_amount_ = iVar2;
  iVar2 = cfd::core::Amount::GetSatoshiValue();
  response->txout_fee_amount_ = iVar2;
  iVar2 = cfd::core::Amount::GetSatoshiValue();
  response->utxo_fee_amount_ = iVar2;
  core::ConfidentialAssetId::~ConfidentialAssetId(&fee_asset);
  std::vector<cfd::api::ElementsUtxoAndOption,_std::allocator<cfd::api::ElementsUtxoAndOption>_>::
  ~vector(&utxos);
  return;
}

Assistant:

void ElementsTransactionJsonApi::EstimateFee(
    EstimateFeeRequest* request, EstimateFeeResponse* response) {
  std::vector<ElementsUtxoAndOption> utxos;

  // elements only.
  ConfidentialAssetId fee_asset;
  if (!request->GetFeeAsset().empty()) {
    fee_asset = ConfidentialAssetId(request->GetFeeAsset());
  }

  for (auto& utxo : request->GetSelectUtxos()) {
    ElementsUtxoAndOption data = {};
    data.utxo.txid = Txid(utxo.GetTxid());
    data.utxo.vout = utxo.GetVout();
    if (!utxo.GetAsset().empty()) {
      data.utxo.asset = ConfidentialAssetId(utxo.GetAsset());
    }
    if (!utxo.GetRedeemScript().empty()) {
      data.utxo.redeem_script = Script(utxo.GetRedeemScript());
    }
    data.utxo.descriptor = utxo.GetDescriptor();
    data.utxo.binary_data = nullptr;
    if (!utxo.GetScriptSigTemplate().empty()) {
      data.utxo.scriptsig_template = Script(utxo.GetScriptSigTemplate());
    }

    data.is_issuance = utxo.GetIsIssuance();
    data.is_blind_issuance = utxo.GetIsBlindIssuance();
    data.is_pegin = utxo.GetIsPegin();
    data.pegin_btc_tx_size = utxo.GetPeginBtcTxSize();
    data.pegin_txoutproof_size = utxo.GetPeginTxOutProofSize();
    if (!utxo.GetClaimScript().empty()) {
      data.claim_script = Script(utxo.GetClaimScript());
    } else if (!utxo.GetFedpegScript().empty()) {
      data.claim_script = Script(utxo.GetFedpegScript());
    }
    utxos.push_back(data);
  }

  Amount tx_fee;
  Amount utxo_fee;
  ElementsTransactionApi api;
  Amount fee = api.EstimateFee(
      request->GetTx(), utxos, fee_asset, &tx_fee, &utxo_fee,
      request->GetIsBlind(), request->GetFeeRate(), request->GetExponent(),
      request->GetMinimumBits());

  response->SetFeeAmount(fee.GetSatoshiValue());
  response->SetTxFeeAmount(tx_fee.GetSatoshiValue());
  response->SetTxoutFeeAmount(tx_fee.GetSatoshiValue());
  response->SetUtxoFeeAmount(utxo_fee.GetSatoshiValue());
}